

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.h
# Opt level: O0

void TTD::NSLogEvents::EventLogEntry_Initialize<(TTD::NSLogEvents::EventKind)67>
               (EventLogEntry *evt,int64 etime)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int64 etime_local;
  EventLogEntry *evt_local;
  
  evt->EventKind = CodeParseActionTag;
  evt->ResultStatus = -1;
  if (((ulong)evt & 3) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTEvents.h"
                       ,0xfe,"(((uint64)evt) % 4 == 0)",
                       "We want this word aligned for performance so who messed it up.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  evt->EventTimeStamp = etime;
  return;
}

Assistant:

void EventLogEntry_Initialize(EventLogEntry* evt, int64 etime)
        {
            evt->EventKind = tag;
            evt->ResultStatus = -1;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            static_assert(TTD_EVENT_BASE_SIZE % 4 == 0, "This should always be word aligned.");
            AssertMsg(((uint64)evt) % 4 == 0, "We want this word aligned for performance so who messed it up.");

            evt->EventTimeStamp = etime;
#endif
        }